

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O3

ogt_vox_transform * ogt_vox_transform_get_identity(void)

{
  ogt_vox_transform *in_RDI;
  
  in_RDI->m00 = 1.0;
  in_RDI->m01 = 0.0;
  in_RDI->m02 = 0.0;
  in_RDI->m03 = 0.0;
  in_RDI->m10 = 0.0;
  in_RDI->m11 = 1.0;
  in_RDI->m12 = 0.0;
  in_RDI->m13 = 0.0;
  in_RDI->m20 = 0.0;
  in_RDI->m21 = 0.0;
  in_RDI->m22 = 1.0;
  in_RDI->m23 = 0.0;
  in_RDI->m30 = 0.0;
  in_RDI->m31 = 0.0;
  in_RDI->m32 = 0.0;
  in_RDI->m33 = 1.0;
  return in_RDI;
}

Assistant:

ogt_vox_transform ogt_vox_transform_get_identity() {
        ogt_vox_transform t;
        t.m00 = 1.0f; t.m01 = 0.0f; t.m02 = 0.0f; t.m03 = 0.0f;
        t.m10 = 0.0f; t.m11 = 1.0f; t.m12 = 0.0f; t.m13 = 0.0f;
        t.m20 = 0.0f; t.m21 = 0.0f; t.m22 = 1.0f; t.m23 = 0.0f;
        t.m30 = 0.0f; t.m31 = 0.0f; t.m32 = 0.0f; t.m33 = 1.0f;
        return t;
    }